

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_LZWDecoder.cc
# Opt level: O0

uchar __thiscall Pl_LZWDecoder::getFirstChar(Pl_LZWDecoder *this,uint code)

{
  ulong uVar1;
  size_type sVar2;
  runtime_error *prVar3;
  uchar *puVar4;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  reference local_38;
  Buffer *b;
  uint local_1c;
  uchar local_15;
  uint idx;
  uchar result;
  Pl_LZWDecoder *pPStack_10;
  uint code_local;
  Pl_LZWDecoder *this_local;
  
  local_15 = 0;
  if (code < 0x100) {
    local_15 = (uchar)code;
  }
  else {
    idx = code;
    pPStack_10 = this;
    if (code < 0x102) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_98,idx);
      std::operator+(&local_78,"Pl_LZWDecoder::getFirstChar called with invalid code (",&local_98);
      std::operator+(&local_58,&local_78,")");
      std::runtime_error::runtime_error(prVar3,(string *)&local_58);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1c = code - 0x102;
    uVar1 = (ulong)local_1c;
    sVar2 = std::vector<Buffer,_std::allocator<Buffer>_>::size(&this->table);
    if (sVar2 <= uVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Pl_LZWDecoder::getFirstChar: table overflow");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_38 = std::vector<Buffer,_std::allocator<Buffer>_>::at(&this->table,(ulong)local_1c);
    puVar4 = Buffer::getBuffer(local_38);
    local_15 = *puVar4;
  }
  return local_15;
}

Assistant:

unsigned char
Pl_LZWDecoder::getFirstChar(unsigned int code)
{
    unsigned char result = '\0';
    if (code < 256) {
        result = static_cast<unsigned char>(code);
    } else if (code > 257) {
        unsigned int idx = code - 258;
        if (idx >= table.size()) {
            throw std::runtime_error("Pl_LZWDecoder::getFirstChar: table overflow");
        }
        Buffer& b = table.at(idx);
        result = b.getBuffer()[0];
    } else {
        throw std::runtime_error(
            "Pl_LZWDecoder::getFirstChar called with invalid code (" + std::to_string(code) + ")");
    }
    return result;
}